

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O3

void __thiscall antlr::LexerInputState::reset(LexerInputState *this)

{
  this->column = 1;
  this->line = 1;
  this->tokenStartColumn = 1;
  this->tokenStartLine = 1;
  this->guessing = 0;
  (*this->input->_vptr_InputBuffer[2])();
  return;
}

Assistant:

virtual void reset( void )
	{
		column = 1;
		line = 1;
		tokenStartColumn = 1;
		tokenStartLine = 1;
		guessing = 0;
		input->reset();
	}